

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

Cavs * Omega_h::unmap_cavs(Cavs *__return_storage_ptr__,LOs *a2b,Cavs *c)

{
  Graph local_90;
  Read<int> local_70 [2];
  Graph local_50;
  Read<int> local_30;
  Cavs *local_20;
  Cavs *c_local;
  LOs *a2b_local;
  
  local_20 = c;
  c_local = (Cavs *)a2b;
  a2b_local = (LOs *)__return_storage_ptr__;
  Read<int>::Read(&local_30,a2b);
  Graph::Graph(&local_50,&c->keys2old_elems);
  unmap_graph(&__return_storage_ptr__->keys2old_elems,&local_30,&local_50);
  Read<int>::Read(local_70,a2b);
  Graph::Graph(&local_90,&c->keys2new_elems);
  unmap_graph(&__return_storage_ptr__->keys2new_elems,local_70,&local_90);
  Graph::~Graph(&local_90);
  Read<int>::~Read(local_70);
  Graph::~Graph(&local_50);
  Read<int>::~Read(&local_30);
  return __return_storage_ptr__;
}

Assistant:

static Cavs unmap_cavs(LOs a2b, Cavs c) {
  return {
      unmap_graph(a2b, c.keys2old_elems), unmap_graph(a2b, c.keys2new_elems)};
}